

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O1

Formattable * icu_63::createArrayCopy(Formattable *array,int32_t count)

{
  undefined1 auVar1 [16];
  ulong *puVar2;
  undefined4 in_register_00000034;
  UMemory *this;
  ulong uVar3;
  Formattable *pFVar4;
  long lVar5;
  Formattable *pFVar6;
  
  uVar3 = (ulong)count;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  this = (UMemory *)0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x70),8) == 0) {
    this = (UMemory *)(SUB168(auVar1 * ZEXT816(0x70),0) | 8);
  }
  puVar2 = (ulong *)UMemory::operator_new__(this,CONCAT44(in_register_00000034,count));
  if (puVar2 == (ulong *)0x0) {
    pFVar6 = (Formattable *)0x0;
  }
  else {
    *puVar2 = uVar3;
    pFVar6 = (Formattable *)(puVar2 + 1);
    if (count != 0) {
      lVar5 = 0;
      pFVar4 = pFVar6;
      do {
        Formattable::Formattable(pFVar4);
        lVar5 = lVar5 + -0x70;
        pFVar4 = pFVar4 + 1;
      } while (uVar3 * -0x70 - lVar5 != 0);
    }
  }
  if (0 < count && pFVar6 != (Formattable *)0x0) {
    uVar3 = (ulong)(uint)count;
    pFVar4 = pFVar6;
    do {
      Formattable::operator=(pFVar4,array);
      pFVar4 = pFVar4 + 1;
      array = array + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return pFVar6;
}

Assistant:

static Formattable* createArrayCopy(const Formattable* array, int32_t count) {
    Formattable *result = new Formattable[count];
    if (result != NULL) {
        for (int32_t i=0; i<count; ++i)
            result[i] = array[i]; // Don't memcpy!
    }
    return result;
}